

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

ActionResultHolder<ot::commissioner::Error> *
testing::internal::ActionResultHolder<ot::commissioner::Error>::
PerformAction<ot::commissioner::Error(ot::commissioner::PendingOperationalDataset_const&)>
          (Action<ot::commissioner::Error_(const_ot::commissioner::PendingOperationalDataset_&)>
           *action,ArgumentTuple *args)

{
  ActionResultHolder<ot::commissioner::Error> *pAVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  Result local_50;
  _Head_base<0UL,_const_ot::commissioner::PendingOperationalDataset_&,_false> local_28;
  
  pAVar1 = (ActionResultHolder<ot::commissioner::Error> *)operator_new(0x30);
  local_28._M_head_impl =
       (args->super__Tuple_impl<0UL,_const_ot::commissioner::PendingOperationalDataset_&>).
       super__Head_base<0UL,_const_ot::commissioner::PendingOperationalDataset_&,_false>.
       _M_head_impl;
  Action<ot::commissioner::Error_(const_ot::commissioner::PendingOperationalDataset_&)>::Perform
            (&local_50,action,(ArgumentTuple *)&local_28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.mMessage._M_dataplus._M_p == &local_50.mMessage.field_2) {
    local_60._8_8_ = local_50.mMessage.field_2._8_8_;
    local_70 = &local_60;
  }
  else {
    local_70 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_50.mMessage._M_dataplus._M_p;
  }
  local_60._M_allocated_capacity._1_7_ = local_50.mMessage.field_2._M_allocated_capacity._1_7_;
  local_60._M_local_buf[0] = local_50.mMessage.field_2._M_local_buf[0];
  (pAVar1->super_UntypedActionResultHolderBase)._vptr_UntypedActionResultHolderBase =
       (_func_int **)&PTR__ActionResultHolder_0039fbf8;
  (pAVar1->result_).value_.mCode = local_50.mCode;
  paVar2 = &(pAVar1->result_).value_.mMessage.field_2;
  (pAVar1->result_).value_.mMessage._M_dataplus._M_p = (pointer)paVar2;
  if (local_70 == &local_60) {
    paVar2->_M_allocated_capacity = local_60._M_allocated_capacity;
    *(undefined8 *)((long)&(pAVar1->result_).value_.mMessage.field_2 + 8) = local_60._8_8_;
  }
  else {
    (pAVar1->result_).value_.mMessage._M_dataplus._M_p = (pointer)local_70;
    (pAVar1->result_).value_.mMessage.field_2._M_allocated_capacity = local_60._M_allocated_capacity
    ;
  }
  (pAVar1->result_).value_.mMessage._M_string_length = local_50.mMessage._M_string_length;
  return pAVar1;
}

Assistant:

static ActionResultHolder* PerformAction(
      const Action<F>& action, typename Function<F>::ArgumentTuple&& args) {
    return new ActionResultHolder(
        Wrapper(action.Perform(std::move(args))));
  }